

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenStructBuilder
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  string *code;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string local_40;
  
  BeginBuilderArgs(this,struct_def,code_ptr);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_82);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"_",&local_83);
  StructBuilderArgs(this,struct_def,&local_40,&local_60,true,&local_80,code_ptr);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)code_ptr);
  StructBuilderBody(this,struct_def,"",code_ptr,0,false);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenStructBuilder(const StructDef &struct_def,
                        std::string *code_ptr) const {
    BeginBuilderArgs(struct_def, code_ptr);
    StructBuilderArgs(struct_def,
                      /* nameprefix = */ "",
                      /* namesuffix = */ "",
                      /* has_field_name = */ true,
                      /* fieldname_suffix = */ "_", code_ptr);
    EndBuilderArgs(code_ptr);

    StructBuilderBody(struct_def, "", code_ptr);
    EndBuilderBody(code_ptr);
  }